

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitStringEq(BinaryInstWriter *this,StringEq *curr)

{
  size_t in_RCX;
  void *__buf;
  int __fd;
  LEB<unsigned_int,_unsigned_char> *this_00;
  LEB<unsigned_int,_unsigned_char> local_24;
  LEB<unsigned_int,_unsigned_char> local_20;
  uchar local_19;
  
  local_19 = 0xfb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_19);
  if (curr->op == StringEqCompare) {
    __fd = (int)this->o;
    this_00 = &local_24;
    local_24.value = 0xa8;
  }
  else {
    if (curr->op != StringEqEqual) {
      handle_unreachable("invalid string.eq*",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                         ,0xa32);
    }
    __fd = (int)this->o;
    this_00 = &local_20;
    local_20.value = 0x89;
  }
  LEB<unsigned_int,_unsigned_char>::write(this_00,__fd,__buf,in_RCX);
  return;
}

Assistant:

void BinaryInstWriter::visitStringEq(StringEq* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringEqEqual:
      o << U32LEB(BinaryConsts::StringEq);
      break;
    case StringEqCompare:
      o << U32LEB(BinaryConsts::StringCompare);
      break;
    default:
      WASM_UNREACHABLE("invalid string.eq*");
  }
}